

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryEmitGeometryShaderTests.cpp
# Opt level: O0

TestCaseGroup * vkt::geometry::createEmitGeometryShaderTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  TestNode *this;
  EmitTest *this_00;
  EmitTestSpec *local_f78;
  string local_bb0;
  string local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  string local_af0;
  string local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  string local_a50;
  string local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  string local_950;
  string local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  int local_86c;
  undefined1 local_866;
  undefined1 local_865;
  int ndx;
  allocator<char> local_860;
  undefined1 local_85f;
  allocator<char> local_85e;
  allocator<char> local_85d;
  undefined1 local_85c;
  allocator<char> local_85b;
  allocator<char> local_85a;
  undefined1 local_859;
  allocator<char> local_858;
  allocator<char> local_857;
  undefined1 local_856;
  allocator<char> local_855;
  allocator<char> local_854;
  undefined1 local_853;
  allocator<char> local_852;
  allocator<char> local_851;
  undefined1 local_850;
  allocator<char> local_84f;
  allocator<char> local_84e;
  undefined1 local_84d;
  allocator<char> local_84c;
  allocator<char> local_84b;
  undefined1 local_84a;
  allocator<char> local_849;
  allocator<char> local_848;
  undefined1 local_847;
  allocator<char> local_846;
  allocator<char> local_845;
  undefined1 local_844;
  allocator<char> local_843;
  allocator<char> local_842;
  undefined1 local_841;
  allocator<char> local_840;
  allocator<char> local_83f;
  undefined1 local_83e;
  allocator<char> local_83d;
  allocator<char> local_83c;
  undefined1 local_83b;
  allocator<char> local_83a;
  allocator<char> local_839;
  undefined1 local_838;
  allocator<char> local_837;
  allocator<char> local_836;
  undefined1 local_835;
  allocator<char> local_834;
  allocator<char> local_833;
  undefined1 local_832;
  allocator<char> local_831;
  allocator<char> local_830;
  undefined1 local_82f;
  allocator<char> local_82e;
  allocator<char> local_82d;
  undefined1 local_82c;
  allocator<char> local_82b;
  allocator<char> local_82a;
  undefined1 local_829;
  allocator<char> local_828;
  allocator<char> local_827;
  undefined1 local_826;
  allocator<char> local_825;
  allocator<char> local_824;
  undefined1 local_823;
  allocator<char> local_822;
  allocator<char> local_821;
  undefined1 *local_820;
  undefined1 local_818 [8];
  EmitTestSpec emitTests [23];
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> emitGroup;
  TestContext *testCtx_local;
  
  emitGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = testCtx;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,(TestContext *)
                    emitGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"emit","Different emit counts.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)(emitTests[0x16].desc.field_2._M_local_buf + 0xb)
            );
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar1
            );
  local_866 = 1;
  local_820 = local_818;
  local_818._0_4_ = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_818._4_4_ = 0;
  emitTests[0].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  emitTests[0].emitCountA = 0;
  emitTests[0].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0].endCountB,"points",&local_821);
  local_823 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0].name.field_2._M_local_buf + 8),"",&local_822);
  local_823 = 0;
  local_820 = (undefined1 *)((long)&emitTests[0].desc.field_2 + 8);
  emitTests[0].desc.field_2._8_4_ = 0;
  emitTests[0].desc.field_2._12_4_ = 0;
  emitTests[1].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
  emitTests[1].emitCountA = 0;
  emitTests[1].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[1].endCountB,"points",&local_824);
  local_826 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[1].name.field_2._M_local_buf + 8),"",&local_825);
  local_826 = 0;
  local_820 = (undefined1 *)((long)&emitTests[1].desc.field_2 + 8);
  emitTests[1].desc.field_2._8_4_ = 0;
  emitTests[1].desc.field_2._12_4_ = 1;
  emitTests[2].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
  emitTests[2].emitCountA = 0;
  emitTests[2].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[2].endCountB,"points",&local_827);
  local_829 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[2].name.field_2._M_local_buf + 8),"",&local_828);
  local_829 = 0;
  local_820 = (undefined1 *)((long)&emitTests[2].desc.field_2 + 8);
  emitTests[2].desc.field_2._8_4_ = 0;
  emitTests[2].desc.field_2._12_4_ = 0;
  emitTests[3].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  emitTests[3].emitCountA = 0;
  emitTests[3].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[3].endCountB,"points",&local_82a);
  local_82c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[3].name.field_2._M_local_buf + 8),"",&local_82b);
  local_82c = 0;
  local_820 = (undefined1 *)((long)&emitTests[3].desc.field_2 + 8);
  emitTests[3].desc.field_2._8_4_ = 0;
  emitTests[3].desc.field_2._12_4_ = 1;
  emitTests[4].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  emitTests[4].emitCountA = 0;
  emitTests[4].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[4].endCountB,"points",&local_82d);
  local_82f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[4].name.field_2._M_local_buf + 8),"",&local_82e);
  local_82f = 0;
  local_820 = (undefined1 *)((long)&emitTests[4].desc.field_2 + 8);
  emitTests[4].desc.field_2._8_4_ = 2;
  emitTests[4].desc.field_2._12_4_ = 0;
  emitTests[5].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  emitTests[5].emitCountA = 0;
  emitTests[5].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[5].endCountB,"line_strip",&local_830);
  local_832 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[5].name.field_2._M_local_buf + 8),"",&local_831);
  local_832 = 0;
  local_820 = (undefined1 *)((long)&emitTests[5].desc.field_2 + 8);
  emitTests[5].desc.field_2._8_4_ = 2;
  emitTests[5].desc.field_2._12_4_ = 0;
  emitTests[6].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
  emitTests[6].emitCountA = 0;
  emitTests[6].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[6].endCountB,"line_strip",&local_833);
  local_835 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[6].name.field_2._M_local_buf + 8),"",&local_834);
  local_835 = 0;
  local_820 = (undefined1 *)((long)&emitTests[6].desc.field_2 + 8);
  emitTests[6].desc.field_2._8_4_ = 2;
  emitTests[6].desc.field_2._12_4_ = 1;
  emitTests[7].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
  emitTests[7].emitCountA = 0;
  emitTests[7].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[7].endCountB,"line_strip",&local_836);
  local_838 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[7].name.field_2._M_local_buf + 8),"",&local_837);
  local_838 = 0;
  local_820 = (undefined1 *)((long)&emitTests[7].desc.field_2 + 8);
  emitTests[7].desc.field_2._8_4_ = 2;
  emitTests[7].desc.field_2._12_4_ = 2;
  emitTests[8].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
  emitTests[8].emitCountA = 0;
  emitTests[8].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[8].endCountB,"line_strip",&local_839);
  local_83b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[8].name.field_2._M_local_buf + 8),"",&local_83a);
  local_83b = 0;
  local_820 = (undefined1 *)((long)&emitTests[8].desc.field_2 + 8);
  emitTests[8].desc.field_2._8_4_ = 2;
  emitTests[8].desc.field_2._12_4_ = 0;
  emitTests[9].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  emitTests[9].emitCountA = 0;
  emitTests[9].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[9].endCountB,"line_strip",&local_83c);
  local_83e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[9].name.field_2._M_local_buf + 8),"",&local_83d);
  local_83e = 0;
  local_820 = (undefined1 *)((long)&emitTests[9].desc.field_2 + 8);
  emitTests[9].desc.field_2._8_4_ = 2;
  emitTests[9].desc.field_2._12_4_ = 1;
  emitTests[10].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  emitTests[10].emitCountA = 0;
  emitTests[10].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[10].endCountB,"line_strip",&local_83f);
  local_841 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[10].name.field_2._M_local_buf + 8),"",&local_840);
  local_841 = 0;
  local_820 = (undefined1 *)((long)&emitTests[10].desc.field_2 + 8);
  emitTests[10].desc.field_2._8_4_ = 2;
  emitTests[10].desc.field_2._12_4_ = 2;
  emitTests[0xb].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  emitTests[0xb].emitCountA = 0;
  emitTests[0xb].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0xb].endCountB,"line_strip",&local_842);
  local_844 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0xb].name.field_2._M_local_buf + 8),"",&local_843);
  local_844 = 0;
  local_820 = (undefined1 *)((long)&emitTests[0xb].desc.field_2 + 8);
  emitTests[0xb].desc.field_2._8_4_ = 2;
  emitTests[0xb].desc.field_2._12_4_ = 2;
  emitTests[0xc].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  emitTests[0xc].emitCountA = 2;
  emitTests[0xc].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0xc].endCountB,"line_strip",&local_845);
  local_847 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0xc].name.field_2._M_local_buf + 8),"",&local_846);
  local_847 = 0;
  local_820 = (undefined1 *)((long)&emitTests[0xc].desc.field_2 + 8);
  emitTests[0xc].desc.field_2._8_4_ = 4;
  emitTests[0xc].desc.field_2._12_4_ = 0;
  emitTests[0xd].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  emitTests[0xd].emitCountA = 0;
  emitTests[0xd].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0xd].endCountB,"triangle_strip",&local_848);
  local_84a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0xd].name.field_2._M_local_buf + 8),"",&local_849);
  local_84a = 0;
  local_820 = (undefined1 *)((long)&emitTests[0xd].desc.field_2 + 8);
  emitTests[0xd].desc.field_2._8_4_ = 4;
  emitTests[0xd].desc.field_2._12_4_ = 0;
  emitTests[0xe].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
  emitTests[0xe].emitCountA = 0;
  emitTests[0xe].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0xe].endCountB,"triangle_strip",&local_84b);
  local_84d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0xe].name.field_2._M_local_buf + 8),"",&local_84c);
  local_84d = 0;
  local_820 = (undefined1 *)((long)&emitTests[0xe].desc.field_2 + 8);
  emitTests[0xe].desc.field_2._8_4_ = 4;
  emitTests[0xe].desc.field_2._12_4_ = 1;
  emitTests[0xf].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
  emitTests[0xf].emitCountA = 0;
  emitTests[0xf].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0xf].endCountB,"triangle_strip",&local_84e);
  local_850 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0xf].name.field_2._M_local_buf + 8),"",&local_84f);
  local_850 = 0;
  local_820 = (undefined1 *)((long)&emitTests[0xf].desc.field_2 + 8);
  emitTests[0xf].desc.field_2._8_4_ = 4;
  emitTests[0xf].desc.field_2._12_4_ = 2;
  emitTests[0x10].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
  emitTests[0x10].emitCountA = 0;
  emitTests[0x10].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0x10].endCountB,"triangle_strip",&local_851);
  local_853 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0x10].name.field_2._M_local_buf + 8),"",&local_852);
  local_853 = 0;
  local_820 = (undefined1 *)((long)&emitTests[0x10].desc.field_2 + 8);
  emitTests[0x10].desc.field_2._8_4_ = 4;
  emitTests[0x10].desc.field_2._12_4_ = 3;
  emitTests[0x11].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
  emitTests[0x11].emitCountA = 0;
  emitTests[0x11].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0x11].endCountB,"triangle_strip",&local_854);
  local_856 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0x11].name.field_2._M_local_buf + 8),"",&local_855);
  local_856 = 0;
  local_820 = (undefined1 *)((long)&emitTests[0x11].desc.field_2 + 8);
  emitTests[0x11].desc.field_2._8_4_ = 4;
  emitTests[0x11].desc.field_2._12_4_ = 0;
  emitTests[0x12].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  emitTests[0x12].emitCountA = 0;
  emitTests[0x12].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0x12].endCountB,"triangle_strip",&local_857);
  local_859 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0x12].name.field_2._M_local_buf + 8),"",&local_858);
  local_859 = 0;
  local_820 = (undefined1 *)((long)&emitTests[0x12].desc.field_2 + 8);
  emitTests[0x12].desc.field_2._8_4_ = 4;
  emitTests[0x12].desc.field_2._12_4_ = 1;
  emitTests[0x13].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  emitTests[0x13].emitCountA = 0;
  emitTests[0x13].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0x13].endCountB,"triangle_strip",&local_85a);
  local_85c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0x13].name.field_2._M_local_buf + 8),"",&local_85b);
  local_85c = 0;
  local_820 = (undefined1 *)((long)&emitTests[0x13].desc.field_2 + 8);
  emitTests[0x13].desc.field_2._8_4_ = 4;
  emitTests[0x13].desc.field_2._12_4_ = 2;
  emitTests[0x14].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  emitTests[0x14].emitCountA = 0;
  emitTests[0x14].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0x14].endCountB,"triangle_strip",&local_85d);
  local_85f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0x14].name.field_2._M_local_buf + 8),"",&local_85e);
  local_85f = 0;
  local_820 = (undefined1 *)((long)&emitTests[0x14].desc.field_2 + 8);
  emitTests[0x14].desc.field_2._8_4_ = 4;
  emitTests[0x14].desc.field_2._12_4_ = 3;
  emitTests[0x15].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  emitTests[0x15].emitCountA = 0;
  emitTests[0x15].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0x15].endCountB,"triangle_strip",&local_860);
  ndx._2_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0x15].name.field_2._M_local_buf + 8),"",
             (allocator<char> *)((long)&ndx + 3));
  ndx._2_1_ = 0;
  local_820 = (undefined1 *)((long)&emitTests[0x15].desc.field_2 + 8);
  emitTests[0x15].desc.field_2._8_4_ = 4;
  emitTests[0x15].desc.field_2._12_4_ = 3;
  emitTests[0x16].primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
  emitTests[0x16].emitCountA = 3;
  emitTests[0x16].endCountA = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitTests[0x16].endCountB,"triangle_strip",
             (allocator<char> *)((long)&ndx + 1));
  local_865 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(emitTests[0x16].name.field_2._M_local_buf + 8),"",(allocator<char> *)&ndx);
  local_865 = 0;
  local_866 = 0;
  std::allocator<char>::~allocator((allocator<char> *)&ndx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx + 3));
  std::allocator<char>::~allocator(&local_860);
  std::allocator<char>::~allocator(&local_85e);
  std::allocator<char>::~allocator(&local_85d);
  std::allocator<char>::~allocator(&local_85b);
  std::allocator<char>::~allocator(&local_85a);
  std::allocator<char>::~allocator(&local_858);
  std::allocator<char>::~allocator(&local_857);
  std::allocator<char>::~allocator(&local_855);
  std::allocator<char>::~allocator(&local_854);
  std::allocator<char>::~allocator(&local_852);
  std::allocator<char>::~allocator(&local_851);
  std::allocator<char>::~allocator(&local_84f);
  std::allocator<char>::~allocator(&local_84e);
  std::allocator<char>::~allocator(&local_84c);
  std::allocator<char>::~allocator(&local_84b);
  std::allocator<char>::~allocator(&local_849);
  std::allocator<char>::~allocator(&local_848);
  std::allocator<char>::~allocator(&local_846);
  std::allocator<char>::~allocator(&local_845);
  std::allocator<char>::~allocator(&local_843);
  std::allocator<char>::~allocator(&local_842);
  std::allocator<char>::~allocator(&local_840);
  std::allocator<char>::~allocator(&local_83f);
  std::allocator<char>::~allocator(&local_83d);
  std::allocator<char>::~allocator(&local_83c);
  std::allocator<char>::~allocator(&local_83a);
  std::allocator<char>::~allocator(&local_839);
  std::allocator<char>::~allocator(&local_837);
  std::allocator<char>::~allocator(&local_836);
  std::allocator<char>::~allocator(&local_834);
  std::allocator<char>::~allocator(&local_833);
  std::allocator<char>::~allocator(&local_831);
  std::allocator<char>::~allocator(&local_830);
  std::allocator<char>::~allocator(&local_82e);
  std::allocator<char>::~allocator(&local_82d);
  std::allocator<char>::~allocator(&local_82b);
  std::allocator<char>::~allocator(&local_82a);
  std::allocator<char>::~allocator(&local_828);
  std::allocator<char>::~allocator(&local_827);
  std::allocator<char>::~allocator(&local_825);
  std::allocator<char>::~allocator(&local_824);
  std::allocator<char>::~allocator(&local_822);
  std::allocator<char>::~allocator(&local_821);
  for (local_86c = 0; local_86c < 0x17; local_86c = local_86c + 1) {
    std::__cxx11::string::string((string *)&local_910,(string *)&emitTests[local_86c].endCountB);
    std::operator+(&local_8f0,&local_910,"_emit_");
    de::toString<int>(&local_930,
                      (int *)(emitTests[(long)local_86c + -1].desc.field_2._M_local_buf + 0xc));
    std::operator+(&local_8d0,&local_8f0,&local_930);
    std::operator+(&local_8b0,&local_8d0,"_end_");
    de::toString<int>(&local_950,(int *)(emitTests + local_86c));
    std::operator+(&local_890,&local_8b0,&local_950);
    std::__cxx11::string::operator=((string *)&emitTests[local_86c].endCountB,(string *)&local_890);
    std::__cxx11::string::~string((string *)&local_890);
    std::__cxx11::string::~string((string *)&local_950);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::__cxx11::string::~string((string *)&local_930);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::__cxx11::string::~string((string *)&local_910);
    std::__cxx11::string::string((string *)&local_a10,(string *)&emitTests[local_86c].endCountB);
    std::operator+(&local_9f0,&local_a10," output, emit ");
    de::toString<int>(&local_a30,
                      (int *)(emitTests[(long)local_86c + -1].desc.field_2._M_local_buf + 0xc));
    std::operator+(&local_9d0,&local_9f0,&local_a30);
    std::operator+(&local_9b0,&local_9d0," vertices, call EndPrimitive ");
    de::toString<int>(&local_a50,(int *)(emitTests + local_86c));
    std::operator+(&local_990,&local_9b0,&local_a50);
    std::operator+(&local_970,&local_990," times");
    std::__cxx11::string::operator=
              ((string *)(emitTests[local_86c].name.field_2._M_local_buf + 8),(string *)&local_970);
    std::__cxx11::string::~string((string *)&local_970);
    std::__cxx11::string::~string((string *)&local_990);
    std::__cxx11::string::~string((string *)&local_a50);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::__cxx11::string::~string((string *)&local_9d0);
    std::__cxx11::string::~string((string *)&local_a30);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::__cxx11::string::~string((string *)&local_a10);
    if (emitTests[local_86c].emitCountA != 0) {
      de::toString<int>(&local_ad0,&emitTests[local_86c].emitCountA);
      std::operator+(&local_ab0,"_emit_",&local_ad0);
      std::operator+(&local_a90,&local_ab0,"_end_");
      de::toString<int>(&local_af0,&emitTests[local_86c].endCountA);
      std::operator+(&local_a70,&local_a90,&local_af0);
      std::__cxx11::string::operator+=
                ((string *)&emitTests[local_86c].endCountB,(string *)&local_a70);
      std::__cxx11::string::~string((string *)&local_a70);
      std::__cxx11::string::~string((string *)&local_af0);
      std::__cxx11::string::~string((string *)&local_a90);
      std::__cxx11::string::~string((string *)&local_ab0);
      std::__cxx11::string::~string((string *)&local_ad0);
      de::toString<int>(&local_b90,&emitTests[local_86c].emitCountA);
      std::operator+(&local_b70,", emit ",&local_b90);
      std::operator+(&local_b50,&local_b70," vertices, call EndPrimitive ");
      de::toString<int>(&local_bb0,&emitTests[local_86c].endCountA);
      std::operator+(&local_b30,&local_b50,&local_bb0);
      std::operator+(&local_b10,&local_b30," times");
      std::__cxx11::string::operator+=
                ((string *)(emitTests[local_86c].name.field_2._M_local_buf + 8),(string *)&local_b10
                );
      std::__cxx11::string::~string((string *)&local_b10);
      std::__cxx11::string::~string((string *)&local_b30);
      std::__cxx11::string::~string((string *)&local_bb0);
      std::__cxx11::string::~string((string *)&local_b50);
      std::__cxx11::string::~string((string *)&local_b70);
      std::__cxx11::string::~string((string *)&local_b90);
    }
    this = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
    this_00 = (EmitTest *)operator_new(200);
    anon_unknown_0::EmitTest::EmitTest
              (this_00,(TestContext *)
                       emitGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,(EmitTestSpec *)(local_818 + (long)local_86c * 0x58));
    tcu::TestNode::addChild(this,(TestNode *)this_00);
  }
  local_f78 = (EmitTestSpec *)((long)&emitTests[0x16].desc.field_2 + 8);
  do {
    local_f78 = local_f78 + -1;
    anon_unknown_0::EmitTestSpec::~EmitTestSpec(local_f78);
  } while (local_f78 != (EmitTestSpec *)local_818);
  pTVar1 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar1;
}

Assistant:

TestCaseGroup* createEmitGeometryShaderTests (TestContext& testCtx)
{
	MovePtr<TestCaseGroup> emitGroup	(new TestCaseGroup(testCtx, "emit", "Different emit counts."));

	// emit different amounts
	{
		EmitTestSpec emitTests[] =
		{
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	0,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	1,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		1,	1,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	2,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		1,	2,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	0,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		1,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		1,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	2,	2,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	0,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	1,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	2,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	1,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	2,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	2,	3,	0,	"triangle_strip",	""},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(emitTests); ++ndx)
		{
			emitTests[ndx].name = std::string(emitTests[ndx].name) + "_emit_" + de::toString(emitTests[ndx].emitCountA) + "_end_" + de::toString(emitTests[ndx].endCountA);
			emitTests[ndx].desc = std::string(emitTests[ndx].name) + " output, emit " + de::toString(emitTests[ndx].emitCountA) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountA) + " times";

			if (emitTests[ndx].emitCountB)
			{
				emitTests[ndx].name += "_emit_" + de::toString(emitTests[ndx].emitCountB) + "_end_" + de::toString(emitTests[ndx].endCountB);
				emitTests[ndx].desc += ", emit " + de::toString(emitTests[ndx].emitCountB) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountB) + " times";
			}

			emitGroup->addChild(new EmitTest(testCtx, emitTests[ndx]));
		}
	}

	return emitGroup.release();
}